

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_suite.cpp
# Opt level: O0

void to_suite::convert_set_double(void)

{
  size_t *this;
  initializer_list<double> __l;
  iterator iVar1;
  iterator iVar2;
  iterator iVar3;
  iterator iVar4;
  basic_variable<std::allocator<char>_> *u;
  basic_variable<std::allocator<char>_> *local_1f0;
  allocator<double> local_1ba;
  less<double> local_1b9;
  double local_1b8 [5];
  iterator local_190;
  size_type local_188;
  undefined1 local_180 [8];
  set<double,_std::less<double>,_std::allocator<double>_> expect;
  set<double,_std::less<double>,_std::allocator<double>_> result;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable input;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_108,1.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_d8,2.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_a8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_78,4.0);
  local_48._0_8_ = &local_108;
  local_48._8_8_ = 4;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,
             (initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> *)local_48);
  local_1f0 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_1f0 = local_1f0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1f0);
  } while (local_1f0 != &local_108);
  trial::dynamic::convert::
  into<std::set<double,std::less<double>,std::allocator<double>>,trial::dynamic::basic_variable<std::allocator<char>>>
            ((set<double,_std::less<double>,_std::allocator<double>_> *)
             &expect._M_t._M_impl.super__Rb_tree_header._M_node_count,(convert *)local_38,u);
  local_1b8[2] = 3.0;
  local_1b8[3] = 4.0;
  local_1b8[0] = 1.0;
  local_1b8[1] = 2.0;
  local_190 = local_1b8;
  local_188 = 4;
  std::allocator<double>::allocator(&local_1ba);
  __l._M_len = local_188;
  __l._M_array = local_190;
  std::set<double,_std::less<double>,_std::allocator<double>_>::set
            ((set<double,_std::less<double>,_std::allocator<double>_> *)local_180,__l,&local_1b9,
             (allocator_type *)&local_1ba);
  std::allocator<double>::~allocator(&local_1ba);
  this = &expect._M_t._M_impl.super__Rb_tree_header._M_node_count;
  iVar1 = std::set<double,_std::less<double>,_std::allocator<double>_>::begin
                    ((set<double,_std::less<double>,_std::allocator<double>_> *)this);
  iVar2 = std::set<double,_std::less<double>,_std::allocator<double>_>::end
                    ((set<double,_std::less<double>,_std::allocator<double>_> *)this);
  iVar3 = std::set<double,_std::less<double>,_std::allocator<double>_>::begin
                    ((set<double,_std::less<double>,_std::allocator<double>_> *)local_180);
  iVar4 = std::set<double,_std::less<double>,_std::allocator<double>_>::end
                    ((set<double,_std::less<double>,_std::allocator<double>_> *)local_180);
  boost::detail::
  test_all_with_impl<std::ostream,std::_Rb_tree_const_iterator<double>,std::_Rb_tree_const_iterator<double>,std::equal_to<double>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/std/set_suite.cpp"
             ,0x7b,"void to_suite::convert_set_double()",iVar1._M_node,iVar2._M_node,iVar3._M_node,
             iVar4._M_node);
  std::set<double,_std::less<double>,_std::allocator<double>_>::~set
            ((set<double,_std::less<double>,_std::allocator<double>_> *)local_180);
  std::set<double,_std::less<double>,_std::allocator<double>_>::~set
            ((set<double,_std::less<double>,_std::allocator<double>_> *)
             &expect._M_t._M_impl.super__Rb_tree_header._M_node_count);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void convert_set_double()
{
    variable input = { 1.0, 2.0, 3.0, 4.0 };
    auto result = convert::into<std::set<double>>(input);

    std::set<double> expect = { 1.0, 2.0, 3.0, 4.0 };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expect.begin(), expect.end(),
                                 std::equal_to<decltype(result)::value_type>());
}